

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::SetProperty_Internal<true>
               (Var receiver,RecyclableObject *object,bool isRoot,PropertyId propertyId,Var newValue
               ,PropertyValueInfo *info,ScriptContext *requestContext,
               PropertyOperationFlags propertyOperationFlags)

{
  Type TVar1;
  Type *typeWithoutProperty;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  BOOL local_44;
  Var pvStack_40;
  BOOL setAccessorResult;
  long *local_38;
  
  if (receiver == (Var)0x0) {
    return 0;
  }
  pvStack_40 = newValue;
  bVar3 = TaggedNumber::Is(receiver);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    local_38 = (long *)receiver;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xae1,"(!TaggedNumber::Is(receiver))","!TaggedNumber::Is(receiver)"
                               );
    if (!bVar3) goto LAB_009ad510;
    *puVar6 = 0;
    receiver = local_38;
  }
  local_44 = 0;
  local_38 = (long *)(ulong)isRoot;
  bVar3 = SetAccessorOrNonWritableProperty
                    (receiver,object,propertyId,pvStack_40,info,requestContext,
                     propertyOperationFlags,isRoot,false,&local_44);
  if (bVar3) {
    return local_44;
  }
  BVar4 = IsObject(receiver);
  if (BVar4 == 0) {
    JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags,requestContext);
    return 0;
  }
  typeWithoutProperty = (object->type).ptr;
  if (!isRoot) {
    pRVar7 = VarTo<Js::RecyclableObject>(receiver);
    while( true ) {
      if (((pRVar7->type).ptr)->typeId == TypeIds_Null) {
        return 0;
      }
      BVar4 = IsPropertyUnscopable(pRVar7,propertyId);
      if (BVar4 != 0) {
        return 0;
      }
      iVar5 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x17])
                        (pRVar7,(ulong)(uint)propertyId,pvStack_40,(ulong)propertyOperationFlags,
                         info);
      if (iVar5 != 0) break;
      pRVar7 = GetPrototypeNoTrap(pRVar7);
    }
    goto LAB_009ad4ca;
  }
  bVar3 = TaggedInt::Is(receiver);
  if ((ulong)receiver >> 0x32 != 0 || bVar3) {
LAB_009ad375:
    bVar3 = TaggedInt::Is(receiver);
    if (!bVar3 && (ulong)receiver >> 0x32 == 0) {
      pRVar7 = UnsafeVarTo<Js::RecyclableObject>(receiver);
      if (pRVar7 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_009ad510;
        *puVar6 = 0;
      }
      TVar1 = ((pRVar7->type).ptr)->typeId;
      if ((int)TVar1 < 0x58) {
        if (TVar1 == TypeIds_LastTrueJavascriptObjectType) goto LAB_009ad4a9;
      }
      else {
        BVar4 = RecyclableObject::IsExternal(pRVar7);
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar3) goto LAB_009ad510;
          *puVar6 = 0;
        }
      }
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xafa,
                                "(JavascriptOperators::GetTypeId(receiver) == TypeIds_GlobalObject || JavascriptOperators::GetTypeId(receiver) == TypeIds_ModuleRoot)"
                                ,"Root must be a global object!");
    if (!bVar3) {
LAB_009ad510:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  else {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(receiver);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_009ad510;
      *puVar6 = 0;
    }
    TVar1 = ((pRVar7->type).ptr)->typeId;
    if (0x57 < (int)TVar1) {
      BVar4 = RecyclableObject::IsExternal(pRVar7);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) goto LAB_009ad510;
        *puVar6 = 0;
      }
      goto LAB_009ad375;
    }
    if (TVar1 != TypeIds_GlobalObject) goto LAB_009ad375;
  }
LAB_009ad4a9:
  iVar5 = (**(code **)(*receiver + 0x370))
                    (receiver,propertyId,pvStack_40,propertyOperationFlags,info);
  if (iVar5 == 0) {
    return 0;
  }
LAB_009ad4ca:
  bVar3 = VarIs<Js::JavascriptProxy>(receiver);
  if (!bVar3) {
    pRVar7 = VarTo<Js::RecyclableObject>(receiver);
    CacheOperators::CachePropertyWrite
              (pRVar7,SUB81(local_38,0),typeWithoutProperty,propertyId,info,requestContext);
    return 1;
  }
  return 1;
}

Assistant:

BOOL JavascriptOperators::SetProperty_Internal(Var receiver, RecyclableObject* object, const bool isRoot, PropertyId propertyId, Var newValue, PropertyValueInfo * info, ScriptContext* requestContext, PropertyOperationFlags propertyOperationFlags)
    {
        if (receiver == nullptr)
        {
            return FALSE;
        }

        Assert(!TaggedNumber::Is(receiver));
        BOOL setAccessorResult = FALSE;
        if (SetAccessorOrNonWritableProperty(receiver, object, propertyId, newValue, info, requestContext, propertyOperationFlags, isRoot, false, &setAccessorResult))
        {
            return setAccessorResult;
        }
        else if (!JavascriptOperators::IsObject(receiver))
        {
            JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
            return FALSE;
        }

#ifdef ENABLE_MUTATION_BREAKPOINT
        // Break on mutation if needed
        bool doNotUpdateCacheForMbp = MutationBreakpoint::IsFeatureEnabled(requestContext) ?
            MutationBreakpoint::HandleSetProperty(requestContext, object, propertyId, newValue) : false;
#endif

        // Get the original type before setting the property
        Type *typeWithoutProperty = object->GetType();
        BOOL didSetProperty = false;
        if (isRoot)
        {
            AssertMsg(JavascriptOperators::GetTypeId(receiver) == TypeIds_GlobalObject
                || JavascriptOperators::GetTypeId(receiver) == TypeIds_ModuleRoot,
                "Root must be a global object!");

            RootObjectBase* rootObject = static_cast<RootObjectBase*>(receiver);
            didSetProperty = rootObject->SetRootProperty(propertyId, newValue, propertyOperationFlags, info);
        }
        else
        {
            RecyclableObject* instanceObject = VarTo<RecyclableObject>(receiver);
            while (!JavascriptOperators::IsNull(instanceObject))
            {
                if (unscopables && JavascriptOperators::IsPropertyUnscopable(instanceObject, propertyId))
                {
                    break;
                }
                else
                {
                    didSetProperty = instanceObject->SetProperty(propertyId, newValue, propertyOperationFlags, info);
                    if (didSetProperty || !unscopables)
                    {
                        break;
                    }
                }
                instanceObject = JavascriptOperators::GetPrototypeNoTrap(instanceObject);
            }
        }

        if (didSetProperty)
        {
            bool updateCache = true;
#ifdef ENABLE_MUTATION_BREAKPOINT
            updateCache = updateCache && !doNotUpdateCacheForMbp;
#endif

            if (updateCache)
            {
                if (!VarIs<JavascriptProxy>(receiver))
                {
                    CacheOperators::CachePropertyWrite(VarTo<RecyclableObject>(receiver), isRoot, typeWithoutProperty, propertyId, info, requestContext);
                }
            }
            return TRUE;
        }

        return FALSE;
    }